

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int handle_unknown_extension
              (ptls_t *tls,ptls_handshake_properties_t *properties,uint16_t type,uint8_t *src,
              uint8_t *end,ptls_raw_extension_t *slots)

{
  uint uVar1;
  _func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *in_RAX;
  uint16_t uVar2;
  
  if ((properties != (ptls_handshake_properties_t *)0x0) &&
     (in_RAX = properties->collect_extension,
     in_RAX != (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0)) {
    uVar1 = (*in_RAX)(tls,properties,type);
    in_RAX = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)(ulong)uVar1;
    if (uVar1 != 0) {
      uVar2 = slots->type;
      if (uVar2 == 0xffff) {
        in_RAX = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)
                 CONCAT71((uint7)(uint3)(uVar1 >> 8),1);
      }
      else {
        in_RAX = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)
                 0xffffffffffffffff;
        do {
          if (in_RAX == (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0xf) {
            __assert_fail("i < MAX_UNKNOWN_EXTENSIONS",
                          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                          ,0x8f8,
                          "int handle_unknown_extension(ptls_t *, ptls_handshake_properties_t *, uint16_t, const uint8_t *, const uint8_t *const, ptls_raw_extension_t *)"
                         );
          }
          if (uVar2 == type) goto LAB_00118cf5;
          uVar2 = slots[1].type;
          slots = slots + 1;
          in_RAX = in_RAX + 1;
        } while (uVar2 != 0xffff);
        in_RAX = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)
                 CONCAT71((int7)((ulong)in_RAX >> 8),
                          in_RAX < (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t
                                    *)0xf);
      }
      if ((char)in_RAX != '\0') {
        slots->type = type;
        (slots->data).base = src;
        (slots->data).len = (long)end - (long)src;
        slots[1].type = 0xffff;
      }
    }
  }
LAB_00118cf5:
  return (int)in_RAX;
}

Assistant:

static int handle_unknown_extension(ptls_t *tls, ptls_handshake_properties_t *properties, uint16_t type, const uint8_t *src,
                                    const uint8_t *const end, ptls_raw_extension_t *slots)
{

    if (properties != NULL && properties->collect_extension != NULL && properties->collect_extension(tls, properties, type)) {
        size_t i;
        for (i = 0; slots[i].type != UINT16_MAX; ++i) {
            assert(i < MAX_UNKNOWN_EXTENSIONS);
            if (slots[i].type == type)
                return PTLS_ALERT_ILLEGAL_PARAMETER;
        }
        if (i < MAX_UNKNOWN_EXTENSIONS) {
            slots[i].type = type;
            slots[i].data = ptls_iovec_init(src, end - src);
            slots[i + 1].type = UINT16_MAX;
        }
    }
    return 0;
}